

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O3

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,IOUAmount *amount,Issue *issue)

{
  mantissa_type mVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  mantissa_type mVar5;
  
  (this->super_STBase).fName = (SField *)sfGeneric;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
  uVar2 = *(undefined8 *)((issue->currency).pn + 2);
  uVar3 = *(undefined8 *)((issue->currency).pn + 4);
  uVar4 = *(undefined8 *)((issue->account).pn + 1);
  *(undefined8 *)(this->mIssue).currency.pn = *(undefined8 *)(issue->currency).pn;
  *(undefined8 *)((this->mIssue).currency.pn + 2) = uVar2;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = uVar3;
  *(undefined8 *)((this->mIssue).account.pn + 1) = uVar4;
  *(undefined8 *)((this->mIssue).account.pn + 3) = *(undefined8 *)((issue->account).pn + 3);
  this->mOffset = amount->exponent_;
  this->mIsNative = false;
  mVar1 = amount->mantissa_;
  this->mIsNegative = SUB81(mVar1 >> 0x3f,0);
  mVar5 = -mVar1;
  if (0 < (long)mVar1) {
    mVar5 = mVar1;
  }
  this->mValue = mVar5;
  canonicalize(this);
  return;
}

Assistant:

STBase::STBase()
    : fName(&sfGeneric)
{
}